

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

uint32_t spvtools::opt::analysis::AddNewConstInGlobals(IRContext *context,uint32_t const_value)

{
  uint32_t res_id;
  uint32_t ty_id;
  Instruction *this;
  TypeManager *this_00;
  initializer_list<unsigned_int> init_list;
  uint32_t local_ac [3];
  SmallVector<unsigned_int,_2UL> local_a0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  SmallVector<unsigned_int,_2UL> local_58;
  
  res_id = IRContext::TakeNextId(context);
  this = (Instruction *)::operator_new(0x70);
  this_00 = IRContext::get_type_mgr(context);
  ty_id = TypeManager::GetUIntTypeId(this_00);
  init_list._M_len = 1;
  init_list._M_array = local_ac;
  local_ac[0] = const_value;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  local_ac[1] = 9;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,&local_58);
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_78,
             local_ac + 1,&local_78);
  Instruction::Instruction(this,context,OpConstant,ty_id,res_id,(OperandList *)&local_78);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_78);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
            ((IntrusiveNodeBase<spvtools::opt::Instruction> *)this,
             (Instruction *)
             ((long)&(((context->module_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                     types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8));
  IRContext::InvalidateAnalyses(context,kAnalysisConstants);
  IRContext::InvalidateAnalyses(context,kAnalysisBegin);
  return res_id;
}

Assistant:

uint32_t AddNewConstInGlobals(IRContext* context, uint32_t const_value) {
  uint32_t id = context->TakeNextId();
  std::unique_ptr<Instruction> new_const(new Instruction(
      context, spv::Op::OpConstant, context->get_type_mgr()->GetUIntTypeId(),
      id,
      {
          {spv_operand_type_t::SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER,
           {const_value}},
      }));
  context->module()->AddGlobalValue(std::move(new_const));
  context->InvalidateAnalyses(IRContext::kAnalysisConstants);
  context->InvalidateAnalyses(IRContext::kAnalysisDefUse);
  return id;
}